

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

int __thiscall
Imf_3_2::DwaCompressor::LossyDctDecoderBase::unRleAc
          (LossyDctDecoderBase *this,unsigned_short **currAcComp,unsigned_short *packedAcEnd,
          unsigned_short *halfZigBlock)

{
  InputExc *this_00;
  long in_RCX;
  ulong in_RDX;
  ulong *in_RSI;
  long in_RDI;
  int dctComp;
  int lastNonZero;
  int local_28;
  int local_24;
  
  local_24 = 0;
  local_28 = 1;
  while( true ) {
    if (0x3f < local_28) {
      return local_24;
    }
    if (in_RDX <= *in_RSI) break;
    if (*(short *)*in_RSI == -0x100) {
      local_28 = 0x40;
    }
    else if ((int)(uint)*(ushort *)*in_RSI >> 8 == 0xff) {
      local_28 = (*(ushort *)*in_RSI & 0xff) + local_28;
    }
    else {
      local_24 = local_28;
      *(undefined2 *)(in_RCX + (long)local_28 * 2) = *(undefined2 *)*in_RSI;
      local_28 = local_28 + 1;
    }
    *(int *)(in_RDI + 0xc) = *(int *)(in_RDI + 0xc) + 1;
    *in_RSI = *in_RSI + 2;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(this_00,"Error uncompressing DWA data (packed AC buffer too small).");
  __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

int
DwaCompressor::LossyDctDecoderBase::unRleAc (
    unsigned short*& currAcComp,
    unsigned short*  packedAcEnd,
    unsigned short*  halfZigBlock)
{
    //
    // Un-RLE the RLE'd blocks. If we find an item whose
    // high byte is 0xff, then insert the number of 0's
    // as indicated by the low byte.
    //
    // Otherwise, just copy the number verbatim.
    //

    int lastNonZero = 0;
    int dctComp     = 1;

    //
    // Start with a zero'ed block, so we don't have to
    // write when we hit a run symbol
    //

    while (dctComp < 64)
    {
        if (currAcComp >= packedAcEnd)
        {
            throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
                                           " (packed AC buffer too small).");
        }
        if (*currAcComp == 0xff00)
        {
            //
            // End of block
            //

            dctComp = 64;
        }
        else if ((*currAcComp) >> 8 == 0xff)
        {
            //
            // Run detected! Insert 0's.
            //
            // Since the block has been zeroed, just advance the ptr
            //

            dctComp += (*currAcComp) & 0xff;
        }
        else
        {
            //
            // Not a run, just copy over the value
            //

            lastNonZero           = dctComp;
            halfZigBlock[dctComp] = *currAcComp;

            dctComp++;
        }

        _packedAcCount++;
        currAcComp++;
    }

    return lastNonZero;
}